

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall ccs::ParserImpl::parseRuleset(ParserImpl *this,Nested *ast)

{
  bool bVar1;
  undefined1 local_28 [24];
  Nested *ast_local;
  ParserImpl *this_local;
  
  local_28._16_8_ = ast;
  ast_local = (Nested *)this;
  advance(this);
  bVar1 = advanceIf(this,CONTEXT);
  if (bVar1) {
    parseContext((ParserImpl *)local_28);
    std::shared_ptr<ccs::ast::SelectorBranch>::operator=
              ((shared_ptr<ccs::ast::SelectorBranch> *)(local_28._16_8_ + 8),
               (shared_ptr<ccs::ast::SelectorBranch> *)local_28);
    std::shared_ptr<ccs::ast::SelectorBranch>::~shared_ptr
              ((shared_ptr<ccs::ast::SelectorBranch> *)local_28);
  }
  while ((this->cur_).type != EOS) {
    parseRule(this,(Nested *)local_28._16_8_);
  }
  return true;
}

Assistant:

bool parseRuleset(ast::Nested &ast) {
    advance();
    if (advanceIf(Token::CONTEXT)) ast.selector_ = parseContext();
    while (cur_.type != Token::EOS) parseRule(ast);
    return true;
  }